

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O3

psa_status_t psa_open_key(psa_key_file_id_t id,psa_key_handle_t *handle)

{
  ushort uVar1;
  psa_status_t pVar2;
  uint uVar3;
  psa_key_slot_t *slot;
  size_t key_data_length;
  uint8_t *key_data;
  size_t local_30;
  uint8_t *local_28;
  
  *handle = 0;
  if ((int)id < 1) {
    pVar2 = -0x87;
  }
  else {
    pVar2 = -0x89;
    if ((global_data._1536_1_ & 1) != 0) {
      *handle = 0x20;
      uVar1 = 0x20;
      do {
        uVar3 = uVar1 - 1;
        if (global_data.key_slots[uVar3].attr.type == 0) {
          slot = global_data.key_slots + uVar3;
          global_data.key_slots[uVar3].attr.lifetime = 1;
          global_data.key_slots[uVar3].attr.id = id;
          local_28 = (uint8_t *)0x0;
          local_30 = 0;
          pVar2 = psa_load_persistent_key(&slot->attr,&local_28,&local_30);
          if (pVar2 == 0) {
            pVar2 = psa_import_key_into_slot(slot,local_28,local_30);
          }
          psa_free_persistent_key_data(local_28,local_30);
          if (pVar2 == 0) {
            return 0;
          }
          psa_wipe_key_slot(slot);
          *handle = 0;
          return pVar2;
        }
        uVar1 = uVar1 - 1;
        *handle = uVar1;
      } while (uVar1 != 0);
      pVar2 = -0x8d;
    }
  }
  return pVar2;
}

Assistant:

psa_status_t psa_open_key( psa_key_file_id_t id, psa_key_handle_t *handle )
{
#if defined(MBEDTLS_PSA_CRYPTO_STORAGE_C)
    psa_status_t status;
    psa_key_slot_t *slot;

    *handle = 0;

    status = psa_validate_persistent_key_parameters(
        PSA_KEY_LIFETIME_PERSISTENT, id, NULL, 0 );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_get_empty_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    slot->attr.lifetime = PSA_KEY_LIFETIME_PERSISTENT;
    slot->attr.id = id;

    status = psa_load_persistent_key_into_slot( slot );
    if( status != PSA_SUCCESS )
    {
        psa_wipe_key_slot( slot );
        *handle = 0;
    }
    return( status );

#else /* defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */
    (void) id;
    *handle = 0;
    return( PSA_ERROR_NOT_SUPPORTED );
#endif /* !defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */
}